

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdManTune(If_DsdMan_t *p,int LutSize,int fFast,int fAdd,int fSpec,int fVerbose)

{
  FILE *pFile;
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  Vec_Int_t *vLits_00;
  ProgressBar *p_00;
  If_DsdObj_t *pObj_00;
  word *pTruth_00;
  word *pTruth;
  uint local_50;
  int nVars;
  int Value;
  int i;
  Vec_Int_t *vLits;
  If_DsdObj_t *pObj;
  sat_solver *pSat;
  ProgressBar *pProgress;
  int fVerbose_local;
  int fSpec_local;
  int fAdd_local;
  int fFast_local;
  int LutSize_local;
  If_DsdMan_t *p_local;
  
  if ((fAdd == 0) || (LutSize == 0)) {
    for (nVars = 0; iVar1 = Vec_PtrSize(&p->vObjs), nVars < iVar1; nVars = nVars + 1) {
      pvVar4 = Vec_PtrEntry(&p->vObjs,nVars);
      *(uint *)((long)pvVar4 + 4) = *(uint *)((long)pvVar4 + 4) & 0xfffffeff;
    }
  }
  if (LutSize != 0) {
    vLits_00 = Vec_IntAlloc(1000);
    pvVar4 = If_ManSatBuildXY(LutSize);
    pFile = _stdout;
    iVar1 = Vec_PtrSize(&p->vObjs);
    p_00 = Extra_ProgressBarStart(pFile,iVar1);
    for (nVars = 0; iVar1 = Vec_PtrSize(&p->vObjs), nVars < iVar1; nVars = nVars + 1) {
      pObj_00 = (If_DsdObj_t *)Vec_PtrEntry(&p->vObjs,nVars);
      Extra_ProgressBarUpdate(p_00,nVars,(char *)0x0);
      iVar1 = If_DsdObjSuppSize(pObj_00);
      if ((LutSize < iVar1) && ((fAdd == 0 || ((*(uint *)&pObj_00->field_0x4 >> 8 & 1) != 0)))) {
        *(uint *)&pObj_00->field_0x4 = *(uint *)&pObj_00->field_0x4 & 0xfffffeff;
        iVar2 = Abc_Var2Lit(nVars,0);
        uVar3 = If_DsdManCheckXY(p,iVar2,LutSize,0,0,0,0);
        if (uVar3 == 0) {
          if (fFast == 0) {
            iVar2 = Abc_Var2Lit(nVars,0);
            pTruth_00 = If_DsdManComputeTruth(p,iVar2,(uchar *)0x0);
            local_50 = If_ManSatCheckXYall(pvVar4,LutSize,pTruth_00,iVar1,vLits_00);
          }
          else {
            local_50 = 0;
          }
          if (local_50 == 0) {
            If_DsdVecObjSetMark(&p->vObjs,nVars);
          }
        }
      }
    }
    Extra_ProgressBarStop(p_00);
    If_ManSatUnbuild(pvVar4);
    Vec_IntFree(vLits_00);
    if (fVerbose != 0) {
      If_DsdManPrintDistrib(p);
    }
  }
  return;
}

Assistant:

void If_DsdManTune( If_DsdMan_t * p, int LutSize, int fFast, int fAdd, int fSpec, int fVerbose )
{
    ProgressBar * pProgress = NULL;
    sat_solver * pSat = NULL;
    If_DsdObj_t * pObj;
    Vec_Int_t * vLits;
    int i, Value, nVars;
    word * pTruth;
    if ( !fAdd || !LutSize )
        If_DsdVecForEachObj( &p->vObjs, pObj, i )
            pObj->fMark = 0;
    if ( LutSize == 0 )
        return;
    vLits = Vec_IntAlloc( 1000 );
    pSat = (sat_solver *)If_ManSatBuildXY( LutSize );
    pProgress = Extra_ProgressBarStart( stdout, Vec_PtrSize(&p->vObjs) );
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        nVars = If_DsdObjSuppSize(pObj);
        if ( nVars <= LutSize )
            continue;
        if ( fAdd && !pObj->fMark )
            continue;
        pObj->fMark = 0;
        if ( If_DsdManCheckXY(p, Abc_Var2Lit(i, 0), LutSize, 0, 0, 0, 0) )
            continue;
        if ( fFast )
            Value = 0;
        else
        {
            pTruth = If_DsdManComputeTruth( p, Abc_Var2Lit(i, 0), NULL );
            Value = If_ManSatCheckXYall( pSat, LutSize, pTruth, nVars, vLits );
        }
        if ( Value )
            continue;
        If_DsdVecObjSetMark( &p->vObjs, i );
    }
    Extra_ProgressBarStop( pProgress );
    If_ManSatUnbuild( pSat );
    Vec_IntFree( vLits );
    if ( fVerbose )
        If_DsdManPrintDistrib( p );
}